

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O0

uint8 * __thiscall
google::protobuf::io::CodedOutputStream::GetDirectBufferForNBytesAndAdvance
          (CodedOutputStream *this,int size)

{
  uint8 *result;
  int size_local;
  CodedOutputStream *this_local;
  
  if (this->buffer_size_ < size) {
    this_local = (CodedOutputStream *)0x0;
  }
  else {
    this_local = (CodedOutputStream *)this->buffer_;
    Advance(this,size);
  }
  return (uint8 *)this_local;
}

Assistant:

inline uint8* CodedOutputStream::GetDirectBufferForNBytesAndAdvance(int size) {
  if (buffer_size_ < size) {
    return NULL;
  } else {
    uint8* result = buffer_;
    Advance(size);
    return result;
  }
}